

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::delaunayrefinement(tetgenmesh *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  arraypool *paVar5;
  memorypool *pmVar6;
  long lVar7;
  double dVar8;
  long bak_flipcount;
  long bak_volref_count;
  long bak_facref_count;
  long bak_segref_count;
  int chkencflag;
  long steinercount;
  face checkseg;
  face checksh;
  triface checktet;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&checksh.shver);
  face::face((face *)&checkseg.shver);
  face::face((face *)&steinercount);
  lVar7 = this->flip23count + this->flip32count + this->flip44count;
  if (this->b->quiet == 0) {
    printf("Refining mesh...\n");
  }
  if (this->b->verbose != 0) {
    printf("  Min radiu-edge ratio = %g.\n",this->b->minratio);
    printf("  Min dihedral   angle = %g.\n",this->b->mindihedral);
  }
  this->steinerleft = (long)this->b->steinerleft;
  if (0 < this->steinerleft) {
    lVar4 = this->st_segref_count + this->st_facref_count + this->st_volref_count;
    if (this->steinerleft <= lVar4) {
      if (this->b->quiet != 0) {
        return;
      }
      printf("\nWarning:  ");
      printf("The desired number of Steiner points (%d) has reached.\n\n",
             (ulong)(uint)this->b->steinerleft);
      return;
    }
    this->steinerleft = this->steinerleft - lVar4;
  }
  if ((this->useinsertradius != 0) &&
     (((this->b->plc != 0 && (this->b->nobisect != 0)) || (this->b->refine != 0)))) {
    makesegmentendpointsmap(this);
    makefacetverticesmap(this);
  }
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,0x10,8);
  this->encseglist = paVar5;
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,0x88,8);
  this->encshlist = paVar5;
  if ((this->b->nobisect == 0) || (this->checkconstraints != 0)) {
    if (this->b->verbose != 0) {
      printf("  Splitting encroached subsegments.\n");
    }
    lVar4 = this->points->items;
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::memorypool(pmVar6,0x10,this->b->shellfaceperblock,8,0);
    this->badsubsegs = pmVar6;
    memorypool::traversalinit(this->subsegs);
    steinercount = (long)shellfacetraverse(this,this->subsegs);
    while (steinercount != 0) {
      enqueuesubface(this,this->badsubsegs,(face *)&steinercount);
      steinercount = (long)shellfacetraverse(this,this->subsegs);
    }
    repairencsegs(this,1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points.\n",this->points->items - lVar4);
    }
    if (1 < this->b->reflevel) {
      if (this->b->verbose != 0) {
        printf("  Splitting encroached subfaces.\n");
      }
      lVar4 = this->points->items;
      lVar1 = this->st_segref_count;
      lVar2 = this->st_facref_count;
      pmVar6 = (memorypool *)operator_new(0x58);
      memorypool::memorypool(pmVar6,0x10,this->b->shellfaceperblock,8,0);
      this->badsubfacs = pmVar6;
      memorypool::traversalinit(this->subfaces);
      checkseg._8_8_ = shellfacetraverse(this,this->subfaces);
      while (checkseg._8_8_ != 0) {
        enqueuesubface(this,this->badsubfacs,(face *)&checkseg.shver);
        checkseg._8_8_ = shellfacetraverse(this,this->subfaces);
      }
      repairencfacs(this,2);
      if (this->b->verbose != 0) {
        printf("  Added %ld (%ld,%ld) Steiner points.\n",this->points->items - lVar4,
               this->st_segref_count - lVar1,this->st_facref_count - lVar2);
      }
    }
  }
  if (2 < this->b->reflevel) {
    if (this->b->verbose != 0) {
      printf("  Splitting bad quality tets.\n");
    }
    lVar4 = this->points->items;
    lVar1 = this->st_segref_count;
    lVar2 = this->st_facref_count;
    lVar3 = this->st_volref_count;
    dVar8 = cos((this->b->mindihedral / 180.0) * PI);
    this->cosmindihed = dVar8;
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::memorypool(pmVar6,0x10,this->b->tetrahedraperblock,8,0);
    this->badtetrahedrons = pmVar6;
    memorypool::traversalinit(this->tetrahedrons);
    checksh._8_8_ = tetrahedrontraverse(this);
    while (checksh._8_8_ != 0) {
      enqueuetetrahedron(this,(triface *)&checksh.shver);
      checksh._8_8_ = tetrahedrontraverse(this);
    }
    repairbadtets(this,4);
    if (this->b->verbose != 0) {
      printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n",this->points->items - lVar4,
             this->st_segref_count - lVar1,this->st_facref_count - lVar2,
             this->st_volref_count - lVar3);
    }
  }
  if ((this->b->verbose != 0) && (lVar7 < this->flip23count + this->flip32count + this->flip44count)
     ) {
    printf("  Performed %ld flips.\n",
           (this->flip23count + this->flip32count + this->flip44count) - lVar7);
  }
  if ((this->steinerleft == 0) && (this->b->quiet == 0)) {
    printf("\nWarnning:  ");
    printf("The desired number of Steiner points (%d) is reached.\n\n",
           (ulong)(uint)this->b->steinerleft);
  }
  paVar5 = this->encseglist;
  if (paVar5 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar5);
    operator_delete(paVar5,0x30);
  }
  paVar5 = this->encshlist;
  if (paVar5 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar5);
    operator_delete(paVar5,0x30);
  }
  this->encseglist = (arraypool *)0x0;
  this->encshlist = (arraypool *)0x0;
  if ((this->b->nobisect == 0) || (this->checkconstraints != 0)) {
    this->totalworkmemory =
         this->badsubsegs->maxitems * (long)this->badsubsegs->itembytes + this->totalworkmemory;
    pmVar6 = this->badsubsegs;
    if (pmVar6 != (memorypool *)0x0) {
      memorypool::~memorypool(pmVar6);
      operator_delete(pmVar6,0x58);
    }
    this->badsubsegs = (memorypool *)0x0;
    if (1 < this->b->reflevel) {
      this->totalworkmemory =
           this->badsubfacs->maxitems * (long)this->badsubfacs->itembytes + this->totalworkmemory;
      pmVar6 = this->badsubfacs;
      if (pmVar6 != (memorypool *)0x0) {
        memorypool::~memorypool(pmVar6);
        operator_delete(pmVar6,0x58);
      }
      this->badsubfacs = (memorypool *)0x0;
    }
  }
  if (2 < this->b->reflevel) {
    this->totalworkmemory =
         this->badtetrahedrons->maxitems * (long)this->badtetrahedrons->itembytes +
         this->totalworkmemory;
    pmVar6 = this->badtetrahedrons;
    if (pmVar6 != (memorypool *)0x0) {
      memorypool::~memorypool(pmVar6);
      operator_delete(pmVar6,0x58);
    }
    this->badtetrahedrons = (memorypool *)0x0;
  }
  return;
}

Assistant:

void tetgenmesh::delaunayrefinement()
{
  triface checktet;
  face checksh;
  face checkseg;
  long steinercount;
  int chkencflag;

  long bak_segref_count, bak_facref_count, bak_volref_count;
  long bak_flipcount = flip23count + flip32count + flip44count;

  if (!b->quiet) {
    printf("Refining mesh...\n");
  }

  if (b->verbose) {
    printf("  Min radiu-edge ratio = %g.\n", b->minratio);
    printf("  Min dihedral   angle = %g.\n", b->mindihedral);
    //printf("  Min Edge length = %g.\n", b->minedgelength);
  }

  steinerleft = b->steinerleft;  // Upperbound of # Steiner points (by -S#).
  if (steinerleft > 0) {
    // Check if we've already used up the given number of Steiner points.
    steinercount = st_segref_count + st_facref_count + st_volref_count;
    if (steinercount < steinerleft) {
      steinerleft -= steinercount;
    } else {
      if (!b->quiet) {
        printf("\nWarning:  ");
        printf("The desired number of Steiner points (%d) has reached.\n\n",
               b->steinerleft);
      }
      return; // No more Steiner points.
    }
  }

  if (useinsertradius) {
    if ((b->plc && b->nobisect) || b->refine) { // '-pY' or '-r' option.
      makesegmentendpointsmap();
      makefacetverticesmap();
    }
  }


  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);


  //if (!b->nobisect) { // if no '-Y' option
  if (!b->nobisect || checkconstraints) {
    if (b->verbose) {
      printf("  Splitting encroached subsegments.\n");
    }

    chkencflag = 1; // Only check encroaching subsegments.
    steinercount = points->items;

    // Initialize the pool of encroached subsegments.
    badsubsegs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                sizeof(void *), 0);

    // Add all segments into the pool.
    subsegs->traversalinit();
    checkseg.sh = shellfacetraverse(subsegs);
    while (checkseg.sh != (shellface *) NULL) {
      enqueuesubface(badsubsegs, &checkseg);
      checkseg.sh = shellfacetraverse(subsegs);
    }

    // Split all encroached segments.
    repairencsegs(chkencflag);

    if (b->verbose) {
      printf("  Added %ld Steiner points.\n", points->items - steinercount);
    }

    if (b->reflevel > 1) { // '-D2' option
      if (b->verbose) {
        printf("  Splitting encroached subfaces.\n");
      }

      chkencflag = 2; // Only check encroaching subfaces.
      steinercount = points->items;
      bak_segref_count = st_segref_count;
      bak_facref_count = st_facref_count;

      // Initialize the pool of encroached subfaces.
      badsubfacs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                  sizeof(void *), 0);

      // Add all subfaces into the pool.
      subfaces->traversalinit();
      checksh.sh = shellfacetraverse(subfaces);
      while (checksh.sh != (shellface *) NULL) {
        enqueuesubface(badsubfacs, &checksh);
        checksh.sh = shellfacetraverse(subfaces);
      }

      // Split all encroached subfaces.
      repairencfacs(chkencflag);

      if (b->verbose) {
        printf("  Added %ld (%ld,%ld) Steiner points.\n",  
               points->items-steinercount, st_segref_count-bak_segref_count,
               st_facref_count-bak_facref_count);
      }
    } // if (b->reflevel > 1)
  } // if (!b->nobisect)

  if (b->reflevel > 2) { // '-D3' option (The default option)
    if (b->verbose) {
      printf("  Splitting bad quality tets.\n");
    }

    chkencflag = 4; // Only check tetrahedra.
    steinercount = points->items;
    bak_segref_count = st_segref_count;
    bak_facref_count = st_facref_count;
    bak_volref_count = st_volref_count;

    // The cosine value of the min dihedral angle (-qq) for tetrahedra.
    cosmindihed = cos(b->mindihedral / 180.0 * PI);

    // Initialize the pool of bad quality tetrahedra.
    badtetrahedrons = new memorypool(sizeof(triface), b->tetrahedraperblock,
                                     sizeof(void *), 0);
    // Add all tetrahedra (no hull tets) into the pool.
    tetrahedrons->traversalinit();
    checktet.tet = tetrahedrontraverse();
    while (checktet.tet != NULL) {
      enqueuetetrahedron(&checktet);
      checktet.tet = tetrahedrontraverse();
    }

    // Split all bad quality tetrahedra.
    repairbadtets(chkencflag);

    if (b->verbose) {
      printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n", 
             points->items - steinercount, 
             st_segref_count - bak_segref_count,
             st_facref_count - bak_facref_count,
             st_volref_count - bak_volref_count);
    }
  } // if (b->reflevel > 2)

  if (b->verbose) {
    if (flip23count + flip32count + flip44count > bak_flipcount) {
      printf("  Performed %ld flips.\n", flip23count + flip32count +
             flip44count - bak_flipcount);
    }
  }

  if (steinerleft == 0) {
    if (!b->quiet) {
      printf("\nWarnning:  ");
      printf("The desired number of Steiner points (%d) is reached.\n\n",
             b->steinerleft);
    }
  }


  delete encseglist;
  delete encshlist;
  encseglist = NULL;
  encshlist = NULL;

  if (!b->nobisect || checkconstraints) {
    totalworkmemory += (badsubsegs->maxitems * badsubsegs->itembytes);
    delete badsubsegs;
    badsubsegs = NULL;
    if (b->reflevel > 1) {
      totalworkmemory += (badsubfacs->maxitems * badsubfacs->itembytes);
      delete badsubfacs;
      badsubfacs = NULL;
    }
  }
  if (b->reflevel > 2) {
    totalworkmemory += (badtetrahedrons->maxitems*badtetrahedrons->itembytes);
    delete badtetrahedrons;
    badtetrahedrons = NULL;
  }
}